

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

value_type __thiscall djb::sgd::g1(sgd *this,vec3 *wi)

{
  long lVar1;
  size_t sVar2;
  float *pfVar3;
  long lVar4;
  vec3 *in_RDX;
  float *extraout_RDX;
  double dVar5;
  value_type vVar6;
  int local_28;
  int i;
  vec3 *wi_local;
  sgd *this_local;
  value_type *g1;
  
  (**(code **)(*(long *)wi + 0x10))();
  for (local_28 = 0; sVar2 = std::valarray<float>::size((valarray<float> *)this),
      local_28 < (int)sVar2; local_28 = local_28 + 1) {
    lVar1 = *(long *)&wi[1].y;
    lVar4 = (long)local_28;
    dVar5 = sgd__g1(in_RDX,*(double *)(lVar1 + 0x100 + lVar4 * 8),
                    *(double *)(lVar1 + 0xd0 + lVar4 * 8),*(double *)(lVar1 + 0xe8 + lVar4 * 8),
                    *(double *)(lVar1 + 0xb8 + lVar4 * 8));
    pfVar3 = std::valarray<float>::operator[]((valarray<float> *)this,(long)local_28);
    *pfVar3 = (float)dVar5;
  }
  vVar6._M_data = extraout_RDX;
  vVar6._M_size = (size_t)this;
  return vVar6;
}

Assistant:

brdf::value_type sgd::g1(const vec3 &wi) const
{
	brdf::value_type g1 = zero_value();

	for (int i = 0; i < (int)g1.size(); ++i)
		g1[i] = sgd__g1(wi, m_data->theta0[i], m_data->c[i],
	                    m_data->k[i], m_data->lambda[i]);

	return g1;
}